

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

string * create_output_path_abi_cxx11_(string *__return_storage_ptr__,char *path)

{
  tm *__tp;
  size_t sVar1;
  time_t rawtime;
  char file_name_buffer [128];
  time_t local_a0;
  char local_98 [128];
  
  time(&local_a0);
  __tp = localtime(&local_a0);
  strftime(local_98,0x80,path,__tp);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar1 = strlen(local_98);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,local_98,local_98 + sVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string create_output_path(const char* path)
{
    time_t rawtime;
    time(&rawtime);
    struct tm* time_info = localtime (&rawtime);
    char file_name_buffer[128];
    strftime(file_name_buffer, 128, path, time_info);

    return file_name_buffer;
}